

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O3

void __thiscall fw::FreeCamera::moveRelatively(FreeCamera *this,vec3 *movement)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  vec3 vVar6;
  vec3 vVar7;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  fVar1 = (movement->field_0).field_0.z;
  vVar6 = getWorldForwardDirection(this);
  fVar2 = (movement->field_0).field_0.x;
  fVar3 = (movement->field_0).field_0.y;
  uVar5 = *(undefined8 *)&(this->_upDirection).field_0;
  fVar4 = (this->_upDirection).field_0.field_0.z;
  vVar7 = getWorldRightDirection(this);
  local_28 = vVar6.field_0._0_4_;
  fStack_24 = vVar6.field_0._4_4_;
  local_38 = (float)uVar5;
  fStack_34 = (float)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)&(this->_worldPosition).field_0;
  *(ulong *)&(this->_worldPosition).field_0 =
       CONCAT44((float)((ulong)uVar5 >> 0x20) +
                fVar2 * vVar7.field_0._4_4_ + fVar3 * fStack_34 + fVar1 * fStack_24,
                (float)uVar5 + fVar2 * vVar7.field_0._0_4_ + fVar3 * local_38 + fVar1 * local_28);
  (this->_worldPosition).field_0.field_0.z =
       vVar7.field_0._8_4_ * fVar2 + fVar4 * fVar3 + vVar6.field_0._8_4_ * fVar1 +
       (this->_worldPosition).field_0.field_0.z;
  return;
}

Assistant:

void FreeCamera::moveRelatively(const glm::vec3& movement)
{
    auto relativeMovement =
        movement.z * getWorldForwardDirection()
        + movement.y * getWorldUpDirection()
        + movement.x * getWorldRightDirection();

    _worldPosition += relativeMovement;
}